

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_L_upper.c
# Opt level: O3

void test_option_L_upper(void)

{
  wchar_t wVar1;
  FILE *__s;
  
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    __s = fopen("filelist","w");
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'!',"file",L'Ƥ',L'\xffffffff',"1234567890");
    fwrite("file\n",5,1,__s);
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'%',"symlink","file",L'\0');
    fwrite("symlink\n",8,1,__s);
    fclose(__s);
    wVar1 = systemf("cat filelist | %s -pd copy >copy.out 2>copy.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'+',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L',',"1 block\n","copy.err");
    failure("Regular -p without -L should preserve symlinks.");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'/',"copy/symlink",(char *)0x0,L'\0');
    wVar1 = systemf("cat filelist | %s -pd -L copy-L >copy-L.out 2>copy-L.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'2',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'3',"copy-L.out");
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'4',"1 block\n","copy-L.err");
    failure("-pdL should dereference symlinks and turn them into files.");
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                     ,L'6',"copy-L/symlink",L'\xffffffff');
    wVar1 = systemf("cat filelist | %s -o >archive.out 2>archive.err",testprog);
    failure("Error invoking %s -o ",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L':',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L';',"1 block\n","archive.err");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                       ,L'=',"unpack",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                    ,L'>',"unpack");
    wVar1 = systemf("cat ../archive.out | %s -i >unpack.out 2>unpack.err",testprog);
    failure("Error invoking %s -i",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'B',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'C',"1 block\n","unpack.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                    ,L'D',"..");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'F',"unpack/symlink",(char *)0x0,L'\0');
    wVar1 = systemf("cat filelist | %s -oL >archive-L.out 2>archive-L.err",testprog);
    failure("Error invoking %s -oL",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'J',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'K',"1 block\n","archive-L.err");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                       ,L'M',"unpack-L",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                    ,L'N',"unpack-L");
    wVar1 = systemf("cat ../archive-L.out | %s -i >unpack-L.out 2>unpack-L.err",testprog);
    failure("Error invoking %s -i < archive-L.out",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                        ,L'R',(long)wVar1,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
               ,L'S',"1 block\n","unpack-L.err");
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                    ,L'T',"..");
    assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                     ,L'U',"unpack-L/symlink",L'\xffffffff');
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_L_upper.c"
                 ,L'\x1a');
  test_skipping("Symlink tests");
  return;
}

Assistant:

DEFINE_TEST(test_option_L_upper)
{
	FILE *filelist;
	int r;

	if (!canSymlink()) {
		skipping("Symlink tests");
		return;
	}

	filelist = fopen("filelist", "w");

	/* Create a file and a symlink to the file. */
	assertMakeFile("file", 0644, "1234567890");
	fprintf(filelist, "file\n");

	/* Symlink to above file. */
	assertMakeSymlink("symlink", "file", 0);
	fprintf(filelist, "symlink\n");

	fclose(filelist);

	r = systemf(CAT " filelist | %s -pd copy >copy.out 2>copy.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "copy.err");

	failure("Regular -p without -L should preserve symlinks.");
	assertIsSymlink("copy/symlink", NULL, 0);

	r = systemf(CAT " filelist | %s -pd -L copy-L >copy-L.out 2>copy-L.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("copy-L.out");
	assertTextFileContents("1 block\n", "copy-L.err");
	failure("-pdL should dereference symlinks and turn them into files.");
	assertIsReg("copy-L/symlink", -1);

	r = systemf(CAT " filelist | %s -o >archive.out 2>archive.err", testprog);
	failure("Error invoking %s -o ", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive.err");

	assertMakeDir("unpack", 0755);
	assertChdir("unpack");
	r = systemf(CAT " .." SEP "archive.out | %s -i >unpack.out 2>unpack.err", testprog);

	failure("Error invoking %s -i", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "unpack.err");
	assertChdir("..");

	assertIsSymlink("unpack/symlink", NULL, 0);

	r = systemf(CAT " filelist | %s -oL >archive-L.out 2>archive-L.err", testprog);
	failure("Error invoking %s -oL", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "archive-L.err");

	assertMakeDir("unpack-L", 0755);
	assertChdir("unpack-L");
	r = systemf(CAT " .." SEP "archive-L.out | %s -i >unpack-L.out 2>unpack-L.err", testprog);

	failure("Error invoking %s -i < archive-L.out", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "unpack-L.err");
	assertChdir("..");
	assertIsReg("unpack-L/symlink", -1);
}